

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__encode_half_float_linear_AR(void *outputp,int width_times_channels,float *encode)

{
  stbir__FP16 *psVar1;
  stbir__FP16 sVar2;
  float *pfVar3;
  stbir__FP16 *psVar4;
  long lVar5;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  psVar1 = (stbir__FP16 *)((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    while ((stbir__FP16 *)((long)outputp + 8) <= psVar1) {
      sVar2 = stbir__float_to_half(encode[1]);
      *(stbir__FP16 *)outputp = sVar2;
      sVar2 = stbir__float_to_half(*encode);
      *(stbir__FP16 *)((long)outputp + 2) = sVar2;
      sVar2 = stbir__float_to_half(encode[3]);
      *(stbir__FP16 *)((long)outputp + 4) = sVar2;
      sVar2 = stbir__float_to_half(encode[2]);
      *(stbir__FP16 *)((long)outputp + 6) = sVar2;
      encode = encode + 4;
      outputp = (stbir__FP16 *)((long)outputp + 8);
    }
    for (lVar5 = 0; (stbir__FP16 *)((long)outputp + lVar5) < psVar1; lVar5 = lVar5 + 4) {
      sVar2 = stbir__float_to_half(*(float *)((long)encode + lVar5 * 2 + 4));
      *(stbir__FP16 *)((long)outputp + lVar5) = sVar2;
      sVar2 = stbir__float_to_half(*(float *)((long)encode + lVar5 * 2));
      *(stbir__FP16 *)((long)outputp + lVar5 + 2) = sVar2;
    }
  }
  else {
    pfVar3 = encode;
    do {
      do {
        fStack_54 = *pfVar3;
        local_58 = pfVar3[1];
        fStack_4c = pfVar3[2];
        fStack_50 = pfVar3[3];
        fStack_44 = pfVar3[4];
        local_48 = pfVar3[5];
        fStack_3c = pfVar3[6];
        fStack_40 = pfVar3[7];
        stbir__float_to_half_SIMD(outputp,&local_58);
        psVar4 = (stbir__FP16 *)((long)outputp + 0x10);
        pfVar3 = pfVar3 + 8;
        outputp = psVar4;
      } while (psVar4 <= psVar1 + -8);
      pfVar3 = encode + (long)width_times_channels + -8;
      outputp = psVar1 + -8;
    } while (psVar4 != psVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}